

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::BlockVariable>::moveAppend
          (QGenericArrayOps<QShaderDescription::BlockVariable> *this,BlockVariable *b,
          BlockVariable *e)

{
  qsizetype *pqVar1;
  BlockVariable *pBVar2;
  
  if (b != e) {
    pBVar2 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).ptr;
    for (; b < e; b = b + 1) {
      QShaderDescription::BlockVariable::BlockVariable
                (pBVar2 + (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size,b)
      ;
      pqVar1 = &(this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }